

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTADSBEx.cpp
# Opt level: O0

bool ADSBExchangeConnection::TestADSBExAPIKeyResult(bool *bIsKeyValid)

{
  bool bVar1;
  future_status fVar2;
  undefined8 in_RDI;
  future<bool> *unaff_retaddr;
  duration<long,_std::ratio<1L,_1000000L>_> *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar3;
  duration<long,std::ratio<1l,1000000l>> local_18 [8];
  undefined8 local_10;
  
  iVar3 = 0;
  local_10 = in_RDI;
  std::chrono::duration<long,std::ratio<1l,1000000l>>::duration<int,void>
            (local_18,(int *)&stack0xffffffffffffffe4);
  fVar2 = std::__basic_future<bool>::wait_for<long,std::ratio<1l,1000000l>>
                    ((__basic_future<bool> *)CONCAT44(iVar3,in_stack_ffffffffffffffe0),
                     in_stack_ffffffffffffffd8);
  if (fVar2 == ready) {
    bVar1 = std::future<bool>::get(unaff_retaddr);
    *(bool *)local_10 = bVar1;
  }
  return fVar2 == ready;
}

Assistant:

bool ADSBExchangeConnection::TestADSBExAPIKeyResult (bool& bIsKeyValid)
{
    // did the check not yet come back?
    if (std::future_status::ready != futADSBExKeyValid.wait_for(std::chrono::microseconds(0)))
        return false;
    
    // is done, return the result
    bIsKeyValid = futADSBExKeyValid.get();
    return true;
}